

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

_Bool sparc_cpu_exec_interrupt(CPUState *cs,int interrupt_request)

{
  uint uVar1;
  
  if ((((interrupt_request & 2U) != 0) && (((ulong)cs[1].tb_jmp_cache[0x57e] & 2) != 0)) &&
     (((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0 ||
      (((ulong)cs[1].tb_jmp_cache[0x5e9] & 4) == 0)))) {
    uVar1 = *(uint *)(cs[1].tb_jmp_cache + 0x22b);
    if ((0 < (int)uVar1) &&
       (((uVar1 & 0xf0) != 0x40 || (*(uint *)(cs[1].tb_jmp_cache + 0x22a) < (uVar1 & 0xf))))) {
      cs->exception_index = uVar1;
      sparc_cpu_do_interrupt_sparc64(cs);
      return true;
    }
  }
  return false;
}

Assistant:

static bool sparc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        SPARCCPU *cpu = SPARC_CPU(cs);
        CPUSPARCState *env = &cpu->env;

        if (cpu_interrupts_enabled(env) && env->interrupt_index > 0) {
            int pil = env->interrupt_index & 0xf;
            int type = env->interrupt_index & 0xf0;

            if (type != TT_EXTINT || cpu_pil_allowed(env, pil)) {
                cs->exception_index = env->interrupt_index;
                sparc_cpu_do_interrupt(cs);
                return true;
            }
        }
    }
    return false;
}